

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

bool google::protobuf::internal::WireFormat::ReadPackedEnumPreserveUnknowns
               (CodedInputStream *input,uint32 field_number,_func_bool_int *is_valid,
               UnknownFieldSet *unknown_fields,RepeatedField<int> *values)

{
  bool bVar1;
  int iVar2;
  uint32 local_44;
  uint32 local_40;
  uint32 temp;
  uint32 length;
  uint32 local_34 [2];
  int value;
  
  temp = field_number;
  bVar1 = io::CodedInputStream::ReadVarint32(input,&local_40);
  if (bVar1) {
    length = io::CodedInputStream::PushLimit(input,local_40);
    while( true ) {
      iVar2 = io::CodedInputStream::BytesUntilLimit(input);
      if (iVar2 < 1) break;
      bVar1 = io::CodedInputStream::ReadVarint32(input,&local_44);
      if (!bVar1) goto LAB_0034ad00;
      local_34[0] = local_44;
      if (is_valid == (_func_bool_int *)0x0) {
LAB_0034ace1:
        RepeatedField<int>::Add(values,(int *)local_34);
      }
      else {
        bVar1 = (*is_valid)(local_44);
        if (bVar1) goto LAB_0034ace1;
        UnknownFieldSet::AddVarint(unknown_fields,temp,(long)(int)local_34[0]);
      }
    }
    io::CodedInputStream::PopLimit(input,length);
    bVar1 = true;
  }
  else {
LAB_0034ad00:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool WireFormat::ReadPackedEnumPreserveUnknowns(io::CodedInputStream* input,
                                                uint32 field_number,
                                                bool (*is_valid)(int),
                                                UnknownFieldSet* unknown_fields,
                                                RepeatedField<int>* values) {
  uint32 length;
  if (!input->ReadVarint32(&length)) return false;
  io::CodedInputStream::Limit limit = input->PushLimit(length);
  while (input->BytesUntilLimit() > 0) {
    int value;
    if (!WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
            input, &value)) {
      return false;
    }
    if (is_valid == NULL || is_valid(value)) {
      values->Add(value);
    } else {
      unknown_fields->AddVarint(field_number, value);
    }
  }
  input->PopLimit(limit);
  return true;
}